

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

void __thiscall
pbrt::anon_struct_8_1_2f67eb89::reportError(anon_struct_8_1_2f67eb89 *this,char *error)

{
  char *local_8;
  
  local_8 = error;
  Error<char_const*&>("%s",&local_8);
  return;
}

Assistant:

void reportError(const char *error) override { Error("%s", error); }